

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdarith.c
# Opt level: O0

boolean decode_mcu_AC_refine(j_decompress_ptr cinfo,JBLOCKROW *MCU_data)

{
  int iVar1;
  int iVar2;
  int iVar3;
  jpeg_entropy_decoder *pjVar4;
  int *piVar5;
  JBLOCKROW paJVar6;
  short sVar7;
  short sVar8;
  int iVar9;
  JCOEF *pJVar10;
  int *natural_order;
  int m1;
  int p1;
  int kex;
  int k;
  int tbl;
  uchar *st;
  JCOEFPTR thiscoef;
  JBLOCKROW block;
  arith_entropy_ptr_conflict entropy;
  JBLOCKROW *MCU_data_local;
  j_decompress_ptr cinfo_local;
  
  pjVar4 = cinfo->entropy;
  if (cinfo->restart_interval != 0) {
    if (*(int *)((long)&pjVar4[4].start_pass + 4) == 0) {
      process_restart(cinfo);
    }
    *(int *)((long)&pjVar4[4].start_pass + 4) = *(int *)((long)&pjVar4[4].start_pass + 4) + -1;
  }
  if (*(int *)&pjVar4[2].start_pass != -1) {
    piVar5 = cinfo->natural_order;
    paJVar6 = *MCU_data;
    iVar1 = cinfo->cur_comp_info[0]->ac_tbl_no;
    iVar2 = cinfo->Al;
    iVar3 = cinfo->Al;
    m1 = cinfo->Se;
    while ((0 < m1 && ((*paJVar6)[piVar5[m1]] == 0))) {
      m1 = m1 + -1;
    }
    p1 = cinfo->Ss;
    while ((p1 <= cinfo->Se &&
           ((_k = (&pjVar4[0xc].decode_mcu)[iVar1] + (p1 + -1) * 3, p1 <= m1 ||
            (iVar9 = arith_decode(cinfo,(uchar *)_k), iVar9 == 0))))) {
      while( true ) {
        pJVar10 = *paJVar6 + piVar5[p1];
        sVar7 = (short)(-1 << ((byte)iVar3 & 0x1f));
        sVar8 = (short)(1 << ((byte)iVar2 & 0x1f));
        if (*pJVar10 != 0) break;
        iVar9 = arith_decode(cinfo,(uchar *)(_k + 1));
        if (iVar9 != 0) {
          iVar9 = arith_decode(cinfo,(uchar *)&pjVar4[0x14].decode_mcu);
          if (iVar9 == 0) {
            *pJVar10 = sVar8;
          }
          else {
            *pJVar10 = sVar7;
          }
          goto LAB_00120bc1;
        }
        _k = _k + 3;
        p1 = p1 + 1;
        if (cinfo->Se < p1) {
          cinfo->err->msg_code = 0x75;
          (*cinfo->err->emit_message)((j_common_ptr)cinfo,-1);
          *(undefined4 *)&pjVar4[2].start_pass = 0xffffffff;
          return 1;
        }
      }
      iVar9 = arith_decode(cinfo,(uchar *)(_k + 2));
      if (iVar9 != 0) {
        if (*pJVar10 < 0) {
          *pJVar10 = *pJVar10 + sVar7;
        }
        else {
          *pJVar10 = *pJVar10 + sVar8;
        }
      }
LAB_00120bc1:
      p1 = p1 + 1;
    }
  }
  return 1;
}

Assistant:

METHODDEF(boolean)
decode_mcu_AC_refine (j_decompress_ptr cinfo, JBLOCKROW *MCU_data)
{
  arith_entropy_ptr entropy = (arith_entropy_ptr) cinfo->entropy;
  JBLOCKROW block;
  JCOEFPTR thiscoef;
  unsigned char *st;
  int tbl, k, kex;
  int p1, m1;
  const int * natural_order;

  /* Process restart marker if needed */
  if (cinfo->restart_interval) {
    if (entropy->restarts_to_go == 0)
      process_restart(cinfo);
    entropy->restarts_to_go--;
  }

  if (entropy->ct == -1) return TRUE;	/* if error do nothing */

  natural_order = cinfo->natural_order;

  /* There is always only one block per MCU */
  block = MCU_data[0];
  tbl = cinfo->cur_comp_info[0]->ac_tbl_no;

  p1 = 1 << cinfo->Al;		/* 1 in the bit position being coded */
  m1 = (-1) << cinfo->Al;	/* -1 in the bit position being coded */

  /* Establish EOBx (previous stage end-of-block) index */
  for (kex = cinfo->Se; kex > 0; kex--)
    if ((*block)[natural_order[kex]]) break;

  for (k = cinfo->Ss; k <= cinfo->Se; k++) {
    st = entropy->ac_stats[tbl] + 3 * (k - 1);
    if (k > kex)
      if (arith_decode(cinfo, st)) break;	/* EOB flag */
    for (;;) {
      thiscoef = *block + natural_order[k];
      if (*thiscoef) {				/* previously nonzero coef */
	if (arith_decode(cinfo, st + 2)) {
	  if (*thiscoef < 0)
	    *thiscoef += m1;
	  else
	    *thiscoef += p1;
	}
	break;
      }
      if (arith_decode(cinfo, st + 1)) {	/* newly nonzero coef */
	if (arith_decode(cinfo, entropy->fixed_bin))
	  *thiscoef = m1;
	else
	  *thiscoef = p1;
	break;
      }
      st += 3; k++;
      if (k > cinfo->Se) {
	WARNMS(cinfo, JWRN_ARITH_BAD_CODE);
	entropy->ct = -1;			/* spectral overflow */
	return TRUE;
      }
    }
  }

  return TRUE;
}